

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pingpong.cpp
# Opt level: O3

void __thiscall vera::PingPong::clear(PingPong *this,float _alpha)

{
  bool bVar1;
  bool bVar2;
  long lVar3;
  
  lVar3 = 0;
  bVar1 = true;
  do {
    bVar2 = bVar1;
    lVar3 = lVar3 * 0x38;
    (**(code **)(*(long *)(&this->field_0x18 + lVar3) + 0x18))(&this->field_0x18 + lVar3);
    glClearColor(0,0,0,_alpha);
    glClear(0x4100);
    (**(code **)(*(long *)(&this->field_0x18 + lVar3) + 0x20))(&this->field_0x18 + lVar3);
    lVar3 = 1;
    bVar1 = false;
  } while (bVar2);
  return;
}

Assistant:

void PingPong::clear(float _alpha) {
    for(int i = 0; i < 2; i++){
        m_fbos[i].bind();
        glClearColor(0.0f, 0.0f, 0.0f, _alpha);
        glClear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);
        m_fbos[i].unbind();
    }
}